

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O1

Hypothesis * __thiscall
sentencepiece::model::FreeList<sentencepiece::unigram::(anonymous_namespace)::Hypothesis>::Allocate
          (FreeList<sentencepiece::unigram::(anonymous_namespace)::Hypothesis> *this)

{
  ulong uVar1;
  size_t sVar2;
  Hypothesis *pHVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  Hypothesis *chunk;
  value_type local_28;
  
  uVar1 = this->chunk_size_;
  if (uVar1 <= this->element_index_) {
    this->chunk_index_ = this->chunk_index_ + 1;
    this->element_index_ = 0;
  }
  if (this->chunk_index_ ==
      (long)(this->freelist_).
            super__Vector_base<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::allocator<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->freelist_).
            super__Vector_base<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::allocator<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar1;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
      uVar5 = SUB168(auVar4 * ZEXT816(0x18),0);
    }
    local_28 = (value_type)operator_new__(uVar5);
    memset(local_28,0,uVar1 * 0x18);
    std::
    vector<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::allocator<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>
    ::push_back(&this->freelist_,&local_28);
  }
  sVar2 = this->element_index_;
  pHVar3 = (this->freelist_).
           super__Vector_base<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::allocator<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>
           ._M_impl.super__Vector_impl_data._M_start[this->chunk_index_];
  this->element_index_ = sVar2 + 1;
  return pHVar3 + sVar2;
}

Assistant:

T* Allocate() {
    if (element_index_ >= chunk_size_) {
      ++chunk_index_;
      element_index_ = 0;
    }

    if (chunk_index_ == freelist_.size()) {
      T* chunk = new T[chunk_size_];
      memset(static_cast<void*>(chunk), 0, sizeof(*chunk) * chunk_size_);
      freelist_.push_back(chunk);
    }

    T* result = freelist_[chunk_index_] + element_index_;
    ++element_index_;

    return result;
  }